

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall
Rml::ElementScroll::EnableScrollbar(ElementScroll *this,Orientation orientation,float element_width)

{
  Element *this_00;
  Vector2f VVar1;
  ComputedValues *this_01;
  LengthPercentageAuto length;
  float fVar2;
  float fVar3;
  float fVar4;
  float fStack_d0;
  float fStack_c0;
  float local_bc;
  Vector2f local_b4;
  undefined1 local_ac [8];
  Box box;
  Property local_68;
  float local_18;
  Orientation local_14;
  float element_width_local;
  Orientation orientation_local;
  ElementScroll *this_local;
  
  local_18 = element_width;
  local_14 = orientation;
  _element_width_local = this;
  if ((this->scrollbars[orientation].enabled & 1U) == 0) {
    CreateScrollbar(this,orientation);
    this_00 = this->scrollbars[local_14].element;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_68,Visible);
    Element::SetProperty(this_00,Visibility,&local_68);
    Property::~Property(&local_68);
    this->scrollbars[local_14].enabled = true;
  }
  Box::Box((Box *)local_ac);
  Vector2<float>::Vector2(&local_b4,local_18,local_18);
  LayoutDetails::BuildBox((Box *)local_ac,local_b4,this->scrollbars[local_14].element,Block);
  if (local_14 == VERTICAL) {
    VVar1 = Box::GetSize((Box *)local_ac,Margin);
    local_bc = VVar1.x;
    this->scrollbars[local_14].size = local_bc;
  }
  if (local_14 == HORIZONTAL) {
    VVar1 = Box::GetSize((Box *)local_ac);
    fStack_c0 = VVar1.y;
    if (0.0 <= fStack_c0) {
      VVar1 = Box::GetSize((Box *)local_ac,Margin);
      fStack_d0 = VVar1.y;
      this->scrollbars[local_14].size = fStack_d0;
    }
    else {
      fVar2 = Box::GetCumulativeEdge((Box *)local_ac,Content,Left);
      fVar3 = Box::GetCumulativeEdge((Box *)local_ac,Content,Right);
      this_01 = Element::GetComputedValues(this->scrollbars[local_14].element);
      length = Style::ComputedValues::height(this_01);
      fVar4 = ResolveValue(length,local_18);
      this->scrollbars[local_14].size = fVar2 + fVar3 + fVar4;
    }
  }
  Box::~Box((Box *)local_ac);
  return;
}

Assistant:

void ElementScroll::EnableScrollbar(Orientation orientation, float element_width)
{
	if (!scrollbars[orientation].enabled)
	{
		CreateScrollbar(orientation);
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
		scrollbars[orientation].enabled = true;
	}

	// Determine the size of the scrollbar.
	Box box;
	LayoutDetails::BuildBox(box, Vector2f(element_width, element_width), scrollbars[orientation].element);

	if (orientation == VERTICAL)
		scrollbars[orientation].size = box.GetSize(BoxArea::Margin).x;
	if (orientation == HORIZONTAL)
	{
		if (box.GetSize().y < 0)
			scrollbars[orientation].size = box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Left) +
				box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Right) +
				ResolveValue(scrollbars[orientation].element->GetComputedValues().height(), element_width);
		else
			scrollbars[orientation].size = box.GetSize(BoxArea::Margin).y;
	}
}